

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

void __thiscall Formula_Context::Clean_Up(Formula_Context *this,Dependency **depends_on)

{
  Dependency *this_00;
  Am_Slot local_30;
  Dependency *local_28;
  Dependency *free_node;
  Dependency *current;
  Dependency **depends_on_local;
  Formula_Context *this_local;
  
  if (this->current_position != (Dependency *)0x0) {
    if (this->last_position == (Dependency *)0x0) {
      *depends_on = (Dependency *)0x0;
    }
    else {
      this->last_position->next = (Dependency *)0x0;
    }
    free_node = this->current_position;
    this->context->internal_remove = true;
    current = (Dependency *)depends_on;
    depends_on_local = (Dependency **)this;
    while (this_00 = free_node, free_node != (Dependency *)0x0) {
      local_28 = free_node;
      free_node = free_node->next;
      Dependency::Remove(this_00);
      Am_Slot::Am_Slot(&local_30,(Am_Slot_Data *)0x0);
      (local_28->depended).data = local_30.data;
      local_28->next = (Dependency *)0x0;
      if (local_28 != (Dependency *)0x0) {
        Dependency::operator_delete(local_28,0x18);
      }
    }
    this->context->internal_remove = false;
  }
  return;
}

Assistant:

void
Formula_Context::Clean_Up(Dependency **depends_on)
{
  if (current_position != nullptr) {
    if (last_position)
      last_position->next = nullptr;
    else
      *depends_on = nullptr;
    Dependency *current = current_position;
    Dependency *free_node;
    context->internal_remove = true;
    while (current) {
      free_node = current;
      current = current->next;
      free_node->Remove();
      free_node->depended = Am_Slot(nullptr);
      free_node->next = nullptr;
      delete free_node;
    }
    context->internal_remove = false;
  }
}